

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall
slang::parsing::Parser::parseModportSubroutinePortList(Parser *this,AttrList attributes)

{
  SyntaxFactory *this_00;
  bool bVar1;
  int iVar2;
  FunctionPrototypeSyntax *prototype;
  ModportSubroutinePortSyntax *pMVar3;
  ModportNamedPortSyntax *pMVar4;
  undefined4 extraout_var;
  ModportSubroutinePortListSyntax *pMVar5;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *src;
  Token TVar6;
  Token importExport;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_180;
  uint local_170;
  size_type local_168;
  pointer local_160;
  size_type local_158;
  Info *local_150;
  undefined8 local_148;
  pointer local_140;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_138 [4];
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> local_60;
  
  local_140 = attributes.data_;
  TVar6 = ParserBase::consume(&this->super_ParserBase);
  local_138[0].data_ = (pointer)local_138[0].firstElement;
  local_138[0].len = 0;
  local_138[0].cap = 8;
  this_00 = &this->factory;
  do {
    local_150 = TVar6.info;
    local_148 = TVar6._0_8_;
    bVar1 = ParserBase::peek(&this->super_ParserBase,FunctionKeyword);
    if (bVar1) {
LAB_0034305a:
      prototype = parseFunctionPrototype
                            (this,Unknown,(bitmask<slang::parsing::detail::FunctionOptions>)0xb,
                             (bool *)0x0);
      pMVar3 = slang::syntax::SyntaxFactory::modportSubroutinePort(this_00,prototype);
      local_180._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar3;
      local_170 = CONCAT31(local_170._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_138,(TokenOrSyntax *)&local_180._M_first);
    }
    else {
      bVar1 = ParserBase::peek(&this->super_ParserBase,TaskKeyword);
      if (bVar1) goto LAB_0034305a;
      TVar6 = ParserBase::expect(&this->super_ParserBase,Identifier);
      pMVar4 = slang::syntax::SyntaxFactory::modportNamedPort(this_00,TVar6);
      local_180._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar4;
      local_170 = CONCAT31(local_170._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_138,(TokenOrSyntax *)&local_180._M_first);
      src = extraout_RDX;
      if ((TVar6._0_4_ >> 0x10 & 1) != 0) {
LAB_0034313c:
        local_170 = 1;
        local_160 = local_140;
        local_180 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
                    ZEXT816(0x508348);
        local_168 = attributes.size_;
        local_158 = attributes.size_;
        iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          (local_138,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                           (EVP_PKEY_CTX *)src);
        local_60.elements.data_ = (pointer)CONCAT44(extraout_var,iVar2);
        local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_60.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
        local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050b730;
        importExport.info = local_150;
        importExport.kind = (undefined2)local_148;
        importExport._2_1_ = local_148._2_1_;
        importExport.numFlags.raw = local_148._3_1_;
        importExport.rawLen = local_148._4_4_;
        pMVar5 = slang::syntax::SyntaxFactory::modportSubroutinePortList
                           (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                    &local_180._M_first,importExport,&local_60);
        if (local_138[0].data_ != (pointer)local_138[0].firstElement) {
          free(local_138[0].data_);
        }
        return &pMVar5->super_MemberSyntax;
      }
    }
    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
    src = extraout_RDX_00;
    if (!bVar1) goto LAB_0034313c;
    TVar6 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar6.kind != FunctionKeyword) {
      TVar6 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar6.kind != TaskKeyword) {
        TVar6 = ParserBase::peek(&this->super_ParserBase,1);
        src = TVar6.info;
        if (TVar6.kind != Identifier) goto LAB_0034313c;
      }
    }
    local_180._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase);
    local_170 = local_170 & 0xffffff00;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_138,(TokenOrSyntax *)&local_180._M_first);
    TVar6.info = local_150;
    TVar6.kind = (undefined2)local_148;
    TVar6._2_1_ = local_148._2_1_;
    TVar6.numFlags.raw = local_148._3_1_;
    TVar6.rawLen = local_148._4_4_;
  } while( true );
}

Assistant:

MemberSyntax& Parser::parseModportSubroutinePortList(AttrList attributes) {
    auto importExport = consume();

    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        if (peek(TokenKind::FunctionKeyword) || peek(TokenKind::TaskKeyword)) {
            auto& proto = parseFunctionPrototype(SyntaxKind::Unknown,
                                                 FunctionOptions::AllowEmptyArgNames |
                                                     FunctionOptions::AllowTasks |
                                                     FunctionOptions::IsPrototype);
            buffer.push_back(&factory.modportSubroutinePort(proto));
        }
        else {
            auto name = expect(TokenKind::Identifier);
            buffer.push_back(&factory.modportNamedPort(name));
            if (name.isMissing())
                break;
        }

        if (!peek(TokenKind::Comma) ||
            (peek(1).kind != TokenKind::FunctionKeyword && peek(1).kind != TokenKind::TaskKeyword &&
             peek(1).kind != TokenKind::Identifier)) {
            break;
        }

        buffer.push_back(consume());
    }

    return factory.modportSubroutinePortList(attributes, importExport, buffer.copy(alloc));
}